

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Mesh::flip_selected_edge(Mesh *this)

{
  HalfedgeElement *this_00;
  Edge *pEVar1;
  HalfedgeIter *this_01;
  pointer this_02;
  EdgeIter *pEVar2;
  EdgeIter e_00;
  EdgeIter e;
  Edge *edge;
  HalfedgeElement *element;
  Mesh *this_local;
  
  if ((((this->super_SceneObject).scene != (Scene *)0x0) &&
      (this_00 = (((this->super_SceneObject).scene)->selected).element,
      this_00 != (HalfedgeElement *)0x0)) &&
     (pEVar1 = HalfedgeElement::getEdge(this_00), pEVar1 != (Edge *)0x0)) {
    this_01 = Edge::halfedge(pEVar1);
    this_02 = std::_List_iterator<CMU462::Halfedge>::operator->(this_01);
    pEVar2 = Halfedge::edge(this_02);
    e_00 = HalfedgeMesh::flipEdge(&this->mesh,pEVar2->_M_node);
    pEVar1 = elementAddress(e_00);
    (((this->super_SceneObject).scene)->selected).element = &pEVar1->super_HalfedgeElement;
    Selection::clear(&((this->super_SceneObject).scene)->hovered);
    Selection::clear(&((this->super_SceneObject).scene)->elementTransform->target);
  }
  return;
}

Assistant:

void Mesh::flip_selected_edge() {
   if( scene == nullptr ) return;
   HalfedgeElement *element = scene->selected.element;
   if (element == nullptr) return;
   Edge *edge = element->getEdge();
   if (edge == nullptr) return;
   EdgeIter e = mesh.flipEdge(edge->halfedge()->edge());
   scene->selected.element = elementAddress( e );
   scene->hovered.clear();
   scene->elementTransform->target.clear();
}